

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprImpliesExpr(Parse *pParse,Expr *pE1,Expr *pE2,int iTab)

{
  Expr *pExpr;
  u8 uVar1;
  int iVar2;
  int iVar3;
  FuncDef *pFVar4;
  ExprList *pEVar5;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  while (iVar2 = sqlite3ExprCompare(pParse,pE1,pE2,iTab), iVar2 != 0) {
    uVar1 = pE2->op;
    if (uVar1 == '+') {
      iVar2 = sqlite3ExprImpliesExpr(pParse,pE1,pE2->pLeft,iTab);
      if ((iVar2 != 0) || (iVar2 = sqlite3ExprImpliesExpr(pParse,pE1,pE2->pRight,iTab), iVar2 != 0))
      break;
      uVar1 = pE2->op;
    }
    if ((uVar1 == '4') && (iVar2 = exprImpliesNotNull(pParse,pE1,pE2->pLeft,iTab,0), iVar2 != 0))
    break;
    iVar3 = 0;
    iVar2 = 0;
    if (pE1->op == 0x9e) {
      if (pE1->pLeft != (Expr *)0x0) goto LAB_0017542a;
    }
    else {
      iVar2 = iVar3;
      if (((pE1->op != 0xac) || ((byte)(*(pE1->u).zToken | 0x20U) != 0x69)) ||
         ((pE1->x).pList == (ExprList *)0x0)) goto LAB_0017542a;
      iVar2 = 0;
      pFVar4 = sqlite3FindFunction(pParse->db,(pE1->u).zToken,((pE1->x).pList)->nExpr,
                                   pParse->db->enc,'\0');
      if (((pFVar4 == (FuncDef *)0x0) || ((pFVar4->funcFlags & 0x400000) == 0)) ||
         (*(int *)&pFVar4->pUserData != 5)) goto LAB_0017542a;
    }
    pEVar5 = (pE1->x).pList;
    if (pEVar5->nExpr != 2) {
      iVar2 = 0;
      if (pEVar5->nExpr != 3) goto LAB_0017542a;
      pExpr = *(Expr **)&pEVar5[1].a[0].fg;
      if ((pExpr->op != 'z') &&
         ((pExpr->op != 0xab || (iVar2 = sqlite3ExprTruthValue(pExpr), iVar2 != 0)))) {
        local_3c = 1;
        iVar2 = 0;
        iVar3 = sqlite3ExprIsInteger(pExpr,&local_3c,(Parse *)0x0);
        if ((iVar3 == 0) || (local_3c != 0)) goto LAB_0017542a;
        pEVar5 = (pE1->x).pList;
      }
    }
    pE1 = pEVar5->a[0].pExpr;
  }
  iVar2 = 1;
LAB_0017542a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprImpliesExpr(
  const Parse *pParse,
  const Expr *pE1,
  const Expr *pE2,
  int iTab
){
  if( sqlite3ExprCompare(pParse, pE1, pE2, iTab)==0 ){
    return 1;
  }
  if( pE2->op==TK_OR
   && (sqlite3ExprImpliesExpr(pParse, pE1, pE2->pLeft, iTab)
             || sqlite3ExprImpliesExpr(pParse, pE1, pE2->pRight, iTab) )
  ){
    return 1;
  }
  if( pE2->op==TK_NOTNULL
   && exprImpliesNotNull(pParse, pE1, pE2->pLeft, iTab, 0)
  ){
    return 1;
  }
  if( sqlite3ExprIsIIF(pParse->db, pE1) ){
    return sqlite3ExprImpliesExpr(pParse,pE1->x.pList->a[0].pExpr,pE2,iTab);
  }
  return 0;
}